

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenavitHartenberg.cpp
# Opt level: O2

bool iDynTree::checkIfAxesAreIncident(Axis *line_A,Axis *line_B,double tol)

{
  bool bVar1;
  undefined1 uVar2;
  undefined8 uVar3;
  RealScalar RVar4;
  RealScalar RVar5;
  Direction originDiffDirection;
  Position closest_point_line_B;
  Position closest_point_line_A;
  Position *local_128 [2];
  Position *local_118;
  Direction *local_100 [2];
  PlainObject local_f0;
  Direction local_d8;
  Position local_c0 [24];
  Position local_a8 [24];
  Axis local_90;
  Axis local_60;
  
  iDynTree::Position::Position(local_a8);
  iDynTree::Position::Position(local_c0);
  iDynTree::Axis::Axis(&local_60,line_A);
  iDynTree::Axis::Axis(&local_90,line_B);
  bVar1 = closestPoints(&local_60,&local_90,local_a8,local_c0,1e-06);
  if (bVar1) {
    local_128[0] = local_a8;
    local_118 = local_c0;
    RVar4 = Eigen::
            MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
            ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                    *)local_128);
    uVar2 = RVar4 < tol;
  }
  else {
    uVar3 = iDynTree::Axis::getOrigin();
    local_118 = (Position *)iDynTree::Axis::getOrigin();
    local_128[0] = (Position *)uVar3;
    RVar5 = Eigen::
            MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
            ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                    *)local_128);
    uVar2 = 1;
    if (tol <= RVar5) {
      uVar3 = iDynTree::Axis::getOrigin();
      local_118 = (Position *)iDynTree::Axis::getOrigin();
      local_128[0] = (Position *)uVar3;
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
      ::normalized(&local_f0,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                    *)local_128);
      local_100[0] = &local_d8;
      Eigen::internal::
      call_assignment<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>,Eigen::Matrix<double,3,1,0,3,1>>
                ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_100,
                 &local_f0);
      iDynTree::Axis::getDirection();
      uVar2 = iDynTree::Direction::isParallel(&local_d8,tol);
    }
  }
  return (bool)uVar2;
}

Assistant:

bool checkIfAxesAreIncident(const iDynTree::Axis line_A,
                            const iDynTree::Axis line_B,
                                  double tol=1e-6)
{
    Position closest_point_line_A, closest_point_line_B;
    bool areAxesNotParallel = closestPoints(line_A, line_B, closest_point_line_A, closest_point_line_B);

    if (areAxesNotParallel)
    {
        bool arePointCoincident = ((toEigen(closest_point_line_A)-toEigen(closest_point_line_B)).norm() < tol);

        return arePointCoincident;
    }
    else
    {
        // If the axes are parallel, the axes are incident if they are coincident
        // In particular, they are coincident either if the origin are coincident
        // or if the difference between the origin is parallel as well
        bool areOriginCoincident = ((toEigen(line_A.getOrigin())-toEigen(line_B.getOrigin())).norm() < tol);

        if (areOriginCoincident)
        {
            return true;
        }

        Direction originDiffDirection;
        toEigen(originDiffDirection) = (toEigen(line_A.getOrigin())-toEigen(line_B.getOrigin())).normalized();

        bool areAxisCoincident = originDiffDirection.isParallel(line_A.getDirection(),tol);

        return areAxisCoincident;
    }
}